

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::ast::StaticInitializerVisitor&>
          (MinTypMaxExpression *this,StaticInitializerVisitor *visitor)

{
  Expression::visit<slang::ast::StaticInitializerVisitor&>(this->min_,visitor);
  Expression::visit<slang::ast::StaticInitializerVisitor&>(this->typ_,visitor);
  Expression::visit<slang::ast::StaticInitializerVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }